

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::SSARewriter::PrintPhiCandidates(SSARewriter *this)

{
  ostream *poVar1;
  CFG *cfg;
  __node_base *p_Var2;
  string local_50;
  
  std::operator<<((ostream *)&std::cerr,"\nPhi candidates:\n");
  p_Var2 = &(this->phi_candidates_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\tBB %");
    BasicBlock::id((BasicBlock *)p_Var2[3]._M_nxt);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,": ");
    cfg = Pass::cfg(&this->pass_->super_Pass);
    PhiCandidate::PrettyPrint_abi_cxx11_(&local_50,(PhiCandidate *)(p_Var2 + 2),cfg);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  return;
}

Assistant:

void SSARewriter::PrintPhiCandidates() const {
  std::cerr << "\nPhi candidates:\n";
  for (const auto& phi_it : phi_candidates_) {
    std::cerr << "\tBB %" << phi_it.second.bb()->id() << ": "
              << phi_it.second.PrettyPrint(pass_->cfg()) << "\n";
  }
  std::cerr << "\n";
}